

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::Opnd::IsEqual(Opnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *opnd_local;
  Opnd *this_local;
  
  switch(this->m_kind) {
  case OpndKindIntConst:
    this_local._7_1_ = IntConstOpnd::IsEqualInternal((IntConstOpnd *)this,opnd);
    break;
  case OpndKindInt64Const:
    this_local._7_1_ = Int64ConstOpnd::IsEqualInternal((Int64ConstOpnd *)this,opnd);
    break;
  case OpndKindFloatConst:
    this_local._7_1_ = FloatConstOpnd::IsEqualInternal((FloatConstOpnd *)this,opnd);
    break;
  case OpndKindFloat32Const:
    this_local._7_1_ = Float32ConstOpnd::IsEqualInternal((Float32ConstOpnd *)this,opnd);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x160,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case OpndKindHelperCall:
    bVar2 = HelperCallOpnd::IsDiagHelperCallOpnd((HelperCallOpnd *)this);
    if (bVar2) {
      this_local._7_1_ = DiagHelperCallOpnd::IsEqualInternalSub((DiagHelperCallOpnd *)this,opnd);
    }
    else {
      this_local._7_1_ = HelperCallOpnd::IsEqualInternal((HelperCallOpnd *)this,opnd);
    }
    break;
  case OpndKindSym:
    this_local._7_1_ = SymOpnd::IsEqualInternal((SymOpnd *)this,opnd);
    break;
  case OpndKindReg:
    this_local._7_1_ = RegOpnd::IsEqualInternal((RegOpnd *)this,opnd);
    break;
  case OpndKindAddr:
    this_local._7_1_ = AddrOpnd::IsEqualInternal((AddrOpnd *)this,opnd);
    break;
  case OpndKindIndir:
    this_local._7_1_ = IndirOpnd::IsEqualInternal((IndirOpnd *)this,opnd);
    break;
  case OpndKindLabel:
    this_local._7_1_ = LabelOpnd::IsEqualInternal((LabelOpnd *)this,opnd);
    break;
  case OpndKindMemRef:
    this_local._7_1_ = MemRefOpnd::IsEqualInternal((MemRefOpnd *)this,opnd);
    break;
  case OpndKindRegBV:
    this_local._7_1_ = RegBVOpnd::IsEqualInternal((RegBVOpnd *)this,opnd);
    break;
  case OpndKindList:
    this_local._7_1_ = ListOpnd::IsEqualInternal((ListOpnd *)this,opnd);
  }
  return this_local._7_1_;
}

Assistant:

bool Opnd::IsEqual(Opnd *opnd)
{
    switch (this->m_kind)
    {
    case OpndKindIntConst:
        return static_cast<IntConstOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindInt64Const:
        return static_cast<Int64ConstOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindFloatConst:
        return static_cast<FloatConstOpnd*>(this)->IsEqualInternal(opnd);
    case OpndKindFloat32Const:
        return static_cast<Float32ConstOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindHelperCall:
        if ((*static_cast<HelperCallOpnd*>(this)).IsDiagHelperCallOpnd())
        {
            return static_cast<DiagHelperCallOpnd*>(this)->IsEqualInternalSub(opnd);
        }
        return static_cast<HelperCallOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindSym:
        //NOTE: use to be Sealed do not do sub class checks like in CloneUse
        return static_cast<SymOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindReg:
        //NOTE: not sealed but ArrayRegOpnd::isEqual function does not exist, default to RegOpnd only
        return static_cast<RegOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindAddr:
        return static_cast<AddrOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindIndir:
        return static_cast<IndirOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindList:
        return static_cast<ListOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindMemRef:
        return static_cast<MemRefOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindLabel:
        return static_cast<LabelOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindRegBV:
        return static_cast<RegBVOpnd*>(this)->IsEqualInternal(opnd);
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    };
}